

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall trun::DirScanner::Scan(DirScanner *this,string *fromdir,bool use_recurse)

{
  string local_40;
  undefined1 local_19;
  string *psStack_18;
  bool use_recurse_local;
  string *fromdir_local;
  DirScanner *this_local;
  
  this->recurse = use_recurse;
  local_19 = use_recurse;
  psStack_18 = fromdir;
  fromdir_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,fromdir);
  DoScan(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return &this->filenames;
}

Assistant:

std::vector<std::string> &Scan(std::string fromdir, bool use_recurse) {
            this->recurse = use_recurse;
            DoScan(fromdir);
            return filenames;
        }